

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

uint16_t wirehair::NextPrime16(uint16_t n)

{
  uint16_t uVar1;
  ulong uVar2;
  ushort in_DI;
  uint8_t p;
  uint i;
  uint8_t *primes;
  uint p_max2;
  uint p_max;
  uint16_t next;
  uint offset;
  uint local_24;
  uint local_14;
  uint local_10;
  uint local_8;
  ushort local_4;
  uint16_t local_2;
  
  switch(in_DI) {
  case 0:
  case 1:
    local_2 = 1;
    break;
  case 2:
    local_2 = 2;
    break;
  case 3:
    local_2 = 3;
    break;
  case 4:
  case 5:
    local_2 = 5;
    break;
  case 6:
  case 7:
    local_2 = 7;
    break;
  default:
    if (in_DI < 0xfff2) {
      local_8 = (ushort)(byte)kSieveTable[(uint)in_DI % 0xd2] + 1 + (uint)in_DI % 0xd2;
      local_4 = in_DI + (byte)kSieveTable[(uint)in_DI % 0xd2];
      uVar1 = FloorSquareRoot16(0);
      local_10 = (uint)uVar1;
      local_14 = local_10 * local_10;
      do {
        local_24 = 0;
        while( true ) {
          if (0x31 < local_24) {
            return local_4;
          }
          if (local_10 < (byte)kPrimesUnder256From11[local_24]) {
            return local_4;
          }
          if ((int)((ulong)local_4 % (ulong)(long)(int)(uint)(byte)kPrimesUnder256From11[local_24])
              == 0) break;
          local_24 = local_24 + 1;
        }
        if (0xd1 < local_8) {
          local_8 = local_8 - 0xd2;
        }
        uVar2 = (ulong)local_8;
        local_8 = (ushort)(byte)kSieveTable[uVar2] + 1 + local_8;
        local_4 = local_4 + (byte)kSieveTable[uVar2] + 1;
        if (local_14 < local_4) {
          local_10 = local_10 + 1;
          local_14 = local_10 * local_10;
        }
      } while( true );
    }
    local_2 = 0;
  }
  return local_2;
}

Assistant:

uint16_t NextPrime16(uint16_t n)
{
    // Handle small n
    switch (n)
    {
    case 0:
        CAT_DEBUG_BREAK(); // Invalid input
    case 1: return 1;
    case 2: return 2;
    case 3: return 3;
    case 4:
    case 5: return 5;
    case 6:
    case 7: return 7;
    }

    // Handle large n
    if (n > 65521) {
        CAT_DEBUG_BREAK(); // Invalid input
        return 0;
    }

    // Choose first n from table
    unsigned offset = n % kSieveTableSize;
    uint16_t next = kSieveTable[offset];
    offset += next + 1;
    n += next;

    // Initialize p_max to floor(sqrt(n))
    unsigned p_max = FloorSquareRoot16(n);
    unsigned p_max2 = p_max * p_max;
    const uint8_t * GF256_RESTRICT primes = &kPrimesUnder256From11[0];

    // For each number to try:
TryNext:

    // For each prime to test up to square root:
    for (unsigned i = 0; i < kPrimesUnder256Count; ++i)
    {
        // If the next prime is above p_max we are done!
        const uint8_t p = primes[i];
        if (p > p_max) {
            return n;
        }

        // If composite, try next n
        if (n % p == 0)
        {
            // Use table to choose next trial number
            if (offset >= kSieveTableSize) {
                offset -= kSieveTableSize;
            }

            // Get next to test
            next = kSieveTable[offset];
            offset += next + 1;
            n += next + 1;

            // Derivative square root iteration of p_max
            if (p_max2 < n)
            {
                ++p_max;
                p_max2 = p_max * p_max;
            }

            goto TryNext;
        }
    }

    return n;
}